

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grouped_aggregate_data.cpp
# Opt level: O2

void __thiscall
duckdb::GroupedAggregateData::SetGroupingFunctions
          (GroupedAggregateData *this,vector<duckdb::vector<unsigned_long,_false>,_true> *functions)

{
  reference pvVar1;
  ulong __n;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  ::std::
  vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
  ::reserve(&(this->grouping_functions).
             super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
            ,((long)(functions->
                    super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                    ).
                    super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(functions->
                   super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                   ).
                   super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (__n = 0; __n < (ulong)(((long)(functions->
                                     super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                                     ).
                                     super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(functions->
                                    super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                                    ).
                                    super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    pvVar1 = vector<duckdb::vector<unsigned_long,_false>,_true>::get<true>(functions,__n);
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         (pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::vector<unsigned_long,true>,std::allocator<duckdb::vector<unsigned_long,true>>>::
    emplace_back<duckdb::vector<unsigned_long,true>>
              ((vector<duckdb::vector<unsigned_long,true>,std::allocator<duckdb::vector<unsigned_long,true>>>
                *)&this->grouping_functions,(vector<unsigned_long,_true> *)&local_48);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void GroupedAggregateData::SetGroupingFunctions(vector<unsafe_vector<idx_t>> &functions) {
	grouping_functions.reserve(functions.size());
	for (idx_t i = 0; i < functions.size(); i++) {
		grouping_functions.push_back(std::move(functions[i]));
	}
}